

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_r2scanl.c
# Opt level: O2

void r2scanl_set_ext_params(xc_func_type *p,double *ext_params)

{
  xc_func_set_ext_params(p->func_aux[1],ext_params);
  return;
}

Assistant:

static void
r2scanl_set_ext_params(xc_func_type *p, const double *ext_params)
{
  const double *par_r2scan = NULL, *par_pc07 = NULL;
  if(ext_params != NULL) {
    par_r2scan = ext_params;
    par_pc07 = ext_params+6;
  }
  assert(p != NULL && p->func_aux != NULL);
  xc_func_set_ext_params(p->func_aux[0], par_r2scan);
  xc_func_set_ext_params(p->func_aux[1], par_pc07);
}